

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

ssize_t __thiscall r_code::SysView::read(SysView *this,int __fd,void *__buf,size_t __nbytes)

{
  undefined4 in_register_00000034;
  Atom local_3c;
  ulong local_38;
  size_t j;
  size_t i;
  size_t reference_set_size;
  size_t code_size;
  uint32_t *data_local;
  SysView *this_local;
  
  code_size = CONCAT44(in_register_00000034,__fd);
  reference_set_size = (size_t)*(uint *)code_size;
  i = (size_t)*(uint *)(code_size + 4);
  data_local = (uint32_t *)this;
  for (j = 0; j < reference_set_size; j = j + 1) {
    Atom::Atom(&local_3c,*(uint32_t *)(code_size + 8 + j * 4));
    vector<r_code::Atom>::push_back(&(this->super_ImageObject).code,&local_3c);
    Atom::~Atom(&local_3c);
  }
  for (local_38 = 0; local_38 < i; local_38 = local_38 + 1) {
    vector<unsigned_int>::push_back
              (&(this->super_ImageObject).references,*(uint *)(code_size + (j + 2 + local_38) * 4));
  }
  return local_38;
}

Assistant:

void SysView::read(uint32_t *data)
{
    size_t code_size = data[0];
    size_t reference_set_size = data[1];
    size_t i;
    size_t j;

    for (i = 0; i < code_size; ++i) {
        code.push_back(Atom(data[2 + i]));
    }

    for (j = 0; j < reference_set_size; ++j) {
        references.push_back(data[2 + i + j]);
    }
}